

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_roa_request.cpp
# Opt level: O1

int __thiscall AliRoaRequest::CommitRequest(AliRoaRequest *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  long *plVar8;
  size_type *psVar9;
  long *plVar10;
  string sign;
  string compose_url;
  string gmt_time;
  key_type local_250;
  long *local_230;
  int local_228;
  long local_220 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  long *local_1f0;
  long local_1e8;
  long local_1e0 [2];
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  string local_50;
  
  getHttpGmtTime_abi_cxx11_();
  local_230 = local_220;
  pcVar4 = (this->super_AliHttpRequest).method_._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_230,pcVar4,
             pcVar4 + (this->super_AliHttpRequest).method_._M_string_length);
  std::__cxx11::string::append((char *)&local_230);
  paVar2 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Accept","");
  this_00 = &(this->super_AliHttpRequest).map_request_headers_;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_250);
  p_Var1 = &(this->super_AliHttpRequest).map_request_headers_._M_t._M_impl.super__Rb_tree_header;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Accept","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_250);
    std::__cxx11::string::_M_append((char *)&local_230,(ulong)(pmVar7->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_230);
  local_250._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Content-Md5","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Content-Md5","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_250);
    std::__cxx11::string::_M_append((char *)&local_230,(ulong)(pmVar7->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_230);
  local_250._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Content-Type","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_250);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
    local_250._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"Content-Type","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_00,&local_250);
    std::__cxx11::string::_M_append((char *)&local_230,(ulong)(pmVar7->_M_dataplus)._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p != paVar2) {
      operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_230);
  std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_1f0);
  std::__cxx11::string::append((char *)&local_230);
  std::__cxx11::string::append((char *)&local_230);
  std::__cxx11::string::append((char *)&local_230);
  std::operator+(&local_210,"x-acs-version:",&this->version_);
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_210);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_250.field_2._M_allocated_capacity = *psVar9;
    local_250.field_2._8_8_ = plVar8[3];
    local_250._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_250.field_2._M_allocated_capacity = *psVar9;
    local_250._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_250._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_210.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar3) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  AliHttpRequest::GetPath_abi_cxx11_(&local_250,&this->super_AliHttpRequest,true);
  std::__cxx11::string::_M_append((char *)&local_230,(ulong)local_250._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != paVar2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (this->secret_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + (this->secret_)._M_string_length);
  encode_compute_hmac_sha1(&local_250,&local_50,(char *)local_230,local_228);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"Authorization","");
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"acs ","");
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_90,(ulong)(this->appid_)._M_dataplus._M_p);
  plVar10 = plVar8 + 2;
  if ((long *)*plVar8 == plVar10) {
    local_1c0 = *plVar10;
    lStack_1b8 = plVar8[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar10;
    local_1d0 = (long *)*plVar8;
  }
  local_1c8 = plVar8[1];
  *plVar8 = (long)plVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_210.field_2._M_allocated_capacity = *psVar9;
    local_210.field_2._8_8_ = plVar8[3];
    local_210._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_210.field_2._M_allocated_capacity = *psVar9;
    local_210._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_210._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_210,(ulong)local_250._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0.field_2._8_8_ = plVar8[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar9;
    local_1b0._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1b0._M_string_length = plVar8[1];
  *plVar8 = (long)psVar9;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_70,&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != paVar3) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"x-acs-signature-method","");
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"HMAC-SHA1","");
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_b0,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"x-acs-signature-version","");
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"1.0","");
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_f0,&local_110);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"x-acs-version","");
  pcVar4 = (this->version_)._M_dataplus._M_p;
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_150,pcVar4,pcVar4 + (this->version_)._M_string_length);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_130,&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"Date","");
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_190,local_1f0,local_1e8 + (long)local_1f0);
  AliHttpRequest::AddRequestHeader(&this->super_AliHttpRequest,&local_170,&local_190);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  iVar5 = AliHttpRequest::CommitRequest(&this->super_AliHttpRequest);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if (local_230 != local_220) {
    operator_delete(local_230,local_220[0] + 1);
  }
  if (local_1f0 != local_1e0) {
    operator_delete(local_1f0,local_1e0[0] + 1);
  }
  return iVar5;
}

Assistant:

int AliRoaRequest::CommitRequest() {
  std::string gmt_time = getHttpGmtTime();

  std::string compose_url = this->method_ + "\n";
  if(map_request_headers_.find("Accept") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Accept"]);
  }
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Md5") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Md5"]);
  } 
  compose_url.append("\n");
  if(map_request_headers_.find("Content-Type") != map_request_headers_.end()) {
    compose_url.append(map_request_headers_["Content-Type"]);
  }

  compose_url.append("\n");
  compose_url.append(gmt_time);
  compose_url.append("\n");
  compose_url.append("x-acs-signature-method:HMAC-SHA1\n");
  compose_url.append("x-acs-signature-version:1.0\n");
  compose_url.append("x-acs-version:" + version_ + "\n");
  compose_url.append(this->GetPath());

  ALI_LOG("compose_url=%s\n", compose_url.c_str());

  std::string sign = encode_compute_hmac_sha1(this->secret_, (char *)compose_url.c_str(), compose_url.size());

  AddRequestHeader("Authorization", std::string("acs ") + appid_ + ":" + sign);
  AddRequestHeader("x-acs-signature-method", "HMAC-SHA1");
  AddRequestHeader("x-acs-signature-version", "1.0");
  AddRequestHeader("x-acs-version", version_);
  AddRequestHeader("Date", gmt_time);
  return AliHttpRequest::CommitRequest();
}